

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void getLinearGradientValues(LinearGradientValues *v,QSpanData *data)

{
  QSpanData *data_local;
  LinearGradientValues *v_local;
  
  v->dx = *(double *)((long)&data->field_23 + 0x18) - *(double *)((long)&data->field_23 + 8);
  v->dy = *(double *)((long)&data->field_23 + 0x20) - *(double *)((long)&data->field_23 + 0x10);
  v->l = v->dx * v->dx + v->dy * v->dy;
  v->off = 0.0;
  if ((v->l != 0.0) || (NAN(v->l))) {
    v->dx = v->dx / v->l;
    v->dy = v->dy / v->l;
    v->off = -v->dx * *(double *)((long)&data->field_23 + 8) +
             -(v->dy * *(double *)((long)&data->field_23 + 0x10));
  }
  return;
}

Assistant:

static void QT_FASTCALL getLinearGradientValues(LinearGradientValues *v, const QSpanData *data)
{
    v->dx = data->gradient.linear.end.x - data->gradient.linear.origin.x;
    v->dy = data->gradient.linear.end.y - data->gradient.linear.origin.y;
    v->l = v->dx * v->dx + v->dy * v->dy;
    v->off = 0;
    if (v->l != 0) {
        v->dx /= v->l;
        v->dy /= v->l;
        v->off = -v->dx * data->gradient.linear.origin.x - v->dy * data->gradient.linear.origin.y;
    }
}